

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

void __thiscall SceneParser::parsePerspectiveCamera(SceneParser *this)

{
  uint __line;
  int iVar1;
  PerspectiveCamera *this_00;
  char *__assertion;
  float fVar2;
  Vector3f up;
  Vector3f direction;
  Vector3f center;
  char token [100];
  
  getToken(this,token);
  if (token._0_2_ == 0x7b) {
    getToken(this,token);
    iVar1 = bcmp(token,"center",7);
    if (iVar1 == 0) {
      readVector3f((SceneParser *)&center);
      getToken(this,token);
      iVar1 = bcmp(token,"direction",10);
      if (iVar1 == 0) {
        readVector3f((SceneParser *)&direction);
        getToken(this,token);
        iVar1 = bcmp(token,"up",3);
        if (iVar1 == 0) {
          readVector3f((SceneParser *)&up);
          getToken(this,token);
          iVar1 = bcmp(token,"angle",6);
          if (iVar1 != 0) {
            __assert_fail("!strcmp(token, \"angle\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                          ,0x82,"void SceneParser::parsePerspectiveCamera()");
          }
          fVar2 = readFloat(this);
          getToken(this,token);
          if (token._0_2_ == 0x7d) {
            this_00 = (PerspectiveCamera *)operator_new(0x40);
            PerspectiveCamera::PerspectiveCamera
                      (this_00,&center,&direction,&up,(fVar2 * 3.1415927) / 180.0);
            this->_camera = (Camera *)this_00;
            return;
          }
          __assert_fail("!strcmp(token, \"}\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                        ,0x86,"void SceneParser::parsePerspectiveCamera()");
        }
        __assertion = "!strcmp(token, \"up\")";
        __line = 0x7f;
      }
      else {
        __assertion = "!strcmp(token, \"direction\")";
        __line = 0x7c;
      }
    }
    else {
      __assertion = "!strcmp(token, \"center\")";
      __line = 0x79;
    }
  }
  else {
    __assertion = "!strcmp(token, \"{\")";
    __line = 0x77;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,__line,"void SceneParser::parsePerspectiveCamera()");
}

Assistant:

void
SceneParser::parsePerspectiveCamera() {
    // Read in the camera parameters.
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "center"));
    Vector3f center = readVector3f();
    getToken(token);
    assert(!strcmp(token, "direction"));
    Vector3f direction = readVector3f();
    getToken(token);
    assert(!strcmp(token, "up"));
    Vector3f up = readVector3f();
    getToken(token);
    assert(!strcmp(token, "angle"));
    float angle_degrees = readFloat();
    float angle_radians = (float) DegreesToRadians(angle_degrees);
    getToken(token);
    assert(!strcmp(token, "}"));
    _camera = new PerspectiveCamera(center, direction, up, angle_radians);
}